

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlockMap.cpp
# Opt level: O2

bool __thiscall
Memory::HeapBlockMap32::
RescanHeapBlockOnOOM<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>>
          (HeapBlockMap32 *this,
          SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *heapBlock,char *pageAddress,
          HeapBlockType blockType,uint bucketIndex,L2MapChunk *chunk,Recycler *recycler)

{
  undefined4 *puVar1;
  code *pcVar2;
  ulong uVar3;
  bool bVar4;
  uint uVar5;
  BVStatic<256UL> *heapBlockMarkBits;
  ulong uVar6;
  ulong uVar7;
  char *blockStartAddress;
  undefined8 *in_FS_OFFSET;
  
  if (heapBlock == (SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                       ,0x46d,"(heapBlock != nullptr)","heapBlock != nullptr");
    if (!bVar4) goto LAB_0023b215;
    *puVar1 = 0;
  }
  if ((heapBlock->super_SmallNormalHeapBlockT<SmallAllocationBlockAttributes>).
      super_SmallHeapBlockT<SmallAllocationBlockAttributes>.super_HeapBlock.heapBlockType !=
      blockType) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                       ,0x46e,"(heapBlock->GetHeapBlockType() == blockType)",
                       "heapBlock->GetHeapBlockType() == blockType");
    if (!bVar4) goto LAB_0023b215;
    *puVar1 = 0;
  }
  heapBlockMarkBits =
       GetMarkBitVectorForPages<256ul>
                 (this,(heapBlock->super_SmallNormalHeapBlockT<SmallAllocationBlockAttributes>).
                       super_SmallHeapBlockT<SmallAllocationBlockAttributes>.super_HeapBlock.address
                 );
  blockStartAddress = (char *)((ulong)pageAddress & 0xfffffffffffff000);
  if (blockStartAddress != pageAddress) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                       ,0x474,"(blockStartAddress == pageAddress)",
                       "blockStartAddress == pageAddress");
    if (!bVar4) {
LAB_0023b215:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar1 = 0;
  }
  uVar5 = SmallHeapBlockT<SmallAllocationBlockAttributes>::GetPageCount
                    ((SmallHeapBlockT<SmallAllocationBlockAttributes> *)heapBlock);
  uVar7 = 0;
  uVar3 = 0;
  if (0 < (int)uVar5) {
    uVar7 = (ulong)uVar5;
  }
  do {
    uVar6 = uVar3;
    if (uVar6 == uVar7) {
      this->anyHeapBlockRescannedDuringOOM = true;
      break;
    }
    bVar4 = SmallNormalHeapBucketBase<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>_>
            ::RescanObjectsOnPage
                      (heapBlock,blockStartAddress + (uint)((int)uVar6 << 0xc),blockStartAddress,
                       heapBlockMarkBits,bucketIndex * 0x10 + 0x10,bucketIndex,(bool *)0x0,recycler)
    ;
    if (!bVar4) {
      HeapBlock::SetNeedOOMRescan((HeapBlock *)heapBlock,recycler);
    }
    bVar4 = Recycler::NeedOOMRescan(recycler);
    uVar3 = uVar6 + 1;
  } while (!bVar4);
  return (long)(int)uVar5 <= (long)uVar6;
}

Assistant:

bool
HeapBlockMap32::RescanHeapBlockOnOOM(TBlockType* heapBlock, char* pageAddress, HeapBlock::HeapBlockType blockType, uint bucketIndex, L2MapChunk * chunk, Recycler * recycler)
{
    // In the OOM codepath, we expect the heap block to be dereferenced since perf is not critical
    Assert(heapBlock != nullptr);
    Assert(heapBlock->GetHeapBlockType() == blockType);
    auto markBits = this->GetMarkBitVectorForPages<TBlockType::HeapBlockAttributes::BitVectorCount>(heapBlock->GetAddress());
    char* blockStartAddress = TBlockType::GetBlockStartAddress(pageAddress);

    // Rescan all pages in this block
    // The following assert makes sure that this method is called only once per heap block
    Assert(blockStartAddress == pageAddress);

    int inUsePageCount = heapBlock->GetPageCount() - heapBlock->GetUnusablePageCount();
    for (int i = 0; i < inUsePageCount; i++)
    {
        char* pageAddressToScan = blockStartAddress + (i * AutoSystemInfo::PageSize);

        if (!SmallNormalHeapBucketBase<TBlockType>::RescanObjectsOnPage(heapBlock,
            pageAddressToScan, blockStartAddress, markBits, HeapInfo::template GetObjectSizeForBucketIndex<typename TBlockType::HeapBlockAttributes>(bucketIndex), bucketIndex, nullptr, recycler))
        {
            // Failed due to OOM
            ((TBlockType*)heapBlock)->SetNeedOOMRescan(recycler);
        }

        if (recycler->NeedOOMRescan())
        {
            // We hit OOM again.  Don't try to process any more blocks, leave them for the next OOM pass.
            return false;
        }
    }

    this->anyHeapBlockRescannedDuringOOM = true;

    return true;
}